

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int CVmObjDate::parse_date_string
              (int32_t *dayno,int32_t *daytime,char *str,vm_val_t *custom,CVmDateLocale *lc,
              multicaldate_t *cal,int32_t refday,int32_t reftime,CVmTimeZone *reftz,
              date_parse_result *resultp,date_parse_string *fmtlist,int *nfmtlist)

{
  ulong len_00;
  int iVar1;
  int32_t iVar2;
  char *p;
  char *pcVar3;
  char *pcVar4;
  long in_RDX;
  int32_t *in_RSI;
  int32_t *in_RDI;
  int reslen;
  date_parse_result curres;
  char *rb;
  size_t curfmtl0;
  char *curfmt0;
  size_t curlen;
  char *curstr;
  char *curfmt;
  size_t curfmtl;
  format_iter fi;
  date_parse_result bestres;
  int bestlen;
  int fcapi;
  date_parse_result result;
  char *filter;
  size_t filterlen;
  size_t len;
  uint in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  int in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  int in_stack_fffffffffffffbf8;
  int32_t in_stack_fffffffffffffbfc;
  date_parse_result *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  size_t *in_stack_fffffffffffffc10;
  CVmDateLocale *in_stack_fffffffffffffc18;
  size_t in_stack_fffffffffffffc30;
  void *in_stack_fffffffffffffc38;
  void *in_stack_fffffffffffffc40;
  ulong local_2c8;
  undefined1 local_288 [40];
  CVmDateLocale *in_stack_fffffffffffffda0;
  size_t in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  size_t *in_stack_fffffffffffffdb8;
  char **in_stack_fffffffffffffdc0;
  date_parse_result *in_stack_fffffffffffffdc8;
  int local_170;
  int local_16c;
  date_parse_result local_168;
  char *local_50;
  undefined8 local_48;
  size_t local_40;
  char *local_20;
  int32_t *local_18;
  int32_t *local_10;
  
  local_20 = (char *)in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = vmb_get_len((char *)0x343362);
  local_20 = (char *)((long)local_20 + 2);
  local_50 = CVmDateLocale::get(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                                in_stack_fffffffffffffc0c);
  date_parse_result::date_parse_result
            ((date_parse_result *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             (multicaldate_t *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  local_16c = 0;
  do {
    if (local_40 == 0) {
      date_parse_result::def_tz
                ((date_parse_result *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (CVmTimeZone *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      date_parse_result::utc_to_local
                (in_stack_fffffffffffffc00,
                 (int32_t *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (int32_t *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      date_parse_result::def_date(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
      date_parse_result::def_time
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8,
                 in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0);
      iVar2 = date_parse_result::dayno
                        ((date_parse_result *)
                         CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      *local_10 = iVar2;
      iVar2 = date_parse_result::daytime(&local_168);
      *local_18 = iVar2;
      caldate_t::normalize
                ((int32_t *)in_stack_fffffffffffffc00,
                 (int32_t *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      date_parse_result::local_to_utc
                (in_stack_fffffffffffffc00,
                 (int32_t *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (int32_t *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
      if (curres._24_8_ != 0) {
        memcpy((void *)curres._24_8_,&local_168,0x118);
      }
      if (curres._40_8_ != 0) {
        *(int *)curres._40_8_ = local_16c;
      }
      return 1;
    }
    local_170 = 0;
    date_parse_result::date_parse_result
              ((date_parse_result *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (multicaldate_t *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    format_iter::format_iter
              ((format_iter *)in_stack_fffffffffffffc00,
               (char **)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (vm_val_t *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
LAB_00343410:
    len_00 = local_2c8;
    p = format_iter::next((format_iter *)
                          CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                          (size_t *)in_stack_fffffffffffffc00);
    pcVar4 = local_20;
    if (p != (char *)0x0) {
      if ((2 < local_2c8) && (*p == '[')) break;
      goto LAB_0034355f;
    }
    if (local_170 == 0) {
      return 0;
    }
    local_20 = local_20 + local_170;
    local_40 = local_40 - (long)local_170;
    memcpy(&local_168,local_288,0x118);
    while( true ) {
      in_stack_fffffffffffffbe8 = in_stack_fffffffffffffbe8 & 0xffffff;
      if (local_40 != 0) {
        pcVar4 = strchr(" \t;,:",(int)*local_20);
        in_stack_fffffffffffffbe8 = CONCAT13(pcVar4 != (char *)0x0,(int3)in_stack_fffffffffffffbe8);
      }
      if ((char)(in_stack_fffffffffffffbe8 >> 0x18) == '\0') break;
      local_20 = local_20 + 1;
      local_40 = local_40 - 1;
    }
    local_16c = local_16c + 1;
  } while( true );
  pcVar3 = lib_strnchr(p + 1,local_2c8 - 1,0x5d);
  if ((pcVar3 == (char *)0x0) ||
     ((pcVar3 + (-1 - (long)p) == (char *)(long)(int)local_48 &&
      (iVar1 = memicmp(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30
                      ), iVar1 == 0)))) {
    local_2c8 = local_2c8 - (long)(pcVar3 + (1 - (long)p));
LAB_0034355f:
    date_parse_result::date_parse_result
              ((date_parse_result *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (date_parse_result *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    iVar1 = parse_string_fmt(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                             in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                             in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    if ((((iVar1 != 0) &&
         (iVar1 = (int)pcVar4 - (int)local_20, in_stack_fffffffffffffbec = iVar1, local_170 < iVar1)
         ) && (memcpy(local_288,&stack0xfffffffffffffbf0,0x118), local_170 = iVar1,
              curres._40_8_ != 0)) && (local_16c < *(int *)curres._40_8_)) {
      date_parse_string::set((date_parse_string *)(curres._32_8_ + (long)local_16c * 0x10),p,len_00)
      ;
    }
  }
  goto LAB_00343410;
}

Assistant:

int CVmObjDate::parse_date_string(
    VMG_ int32_t &dayno, int32_t &daytime,
    const char *str, const vm_val_t *custom, CVmDateLocale *lc,
    multicaldate_t *cal, int32_t refday, int32_t reftime, CVmTimeZone *reftz,
    date_parse_result *resultp, date_parse_string *fmtlist, int *nfmtlist)
{
    /* get the string length and buffer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* format list */
    static const char *fmt[] =
    {
        /* US-style dates, with the month first */
        "[us]m / d / y",
        "[us]m / d",
        "[us]m - d",
        "[us]m . d",
        "[us]m .\t- d .\t- y",

        /* European-style date formats, with day/month order */
        "[eu]d / m / y",
        "[eu]d / m",
        "[eu]d - m",
        "[eu]d . m",
        "[eu]d .\t- m .\t- y",

        /* match some special computer formats first */
        "yyyy mm dd",                             /* 8-digit year month day */
        "yyyy .? doy",                   /* PostreSQL year with day-of-year */

        /* universal date formats */
        "m / y",
        "m - y",
        "month _.\t-* ddth _,.\t+ ye",
        "ddth _.\t-* month _,.\t-* ye",
        "month _.\t-* ddth",
        "ddth _.\t-* month",
        "month - dd - ye",
        "month _\t.-* y",
        "month",
        "+- y - mm - dd",
        "y / m / d",
        "y - m - d",
        "y / m",
        "y - m",
        "ye _\t.-* month _\t.-* d",
        "ye _\t.-* month",
        "ye - month - dd",
        "yyyy",
        "era _* y",
        "y _* era",

        /* time formats */
        "h _? ampm",
        "h : mi",
        "h .: mi _? ampm",
        "h .: mi .: ss _? ampm",
        "h : mi : ss",
        "h : mi : ss .: ssfrac _? ampm",
        "h : mi : ss .: ssfrac",
        "tT? hh .: mi",
        "tT? hh mi",
        "tT? hh .: mi .: ss",
        "tT? hh mi SS",
        "tT? hh .: mi .: ss _? tz",
        "tT? hh .: mi .: ss . ssfrac",
        "tz",

        /* special formats (ISO, other software, etc) */
        "d / mon / yyyy : hh : mi : ss _ gmtofs",         /* Unix log files */
        "yyyy : mm : dd _ hh : mi : ss",                            /* EXIF */
        "yyyy -? \\W W",                          /* ISO year with ISO week */
        "yyyy - mm - dd \\T hh : mi : ss . ssfrac",                 /* SOAP */
        "yyyy - mm - dd \\T hh : mi : ss . ssfrac gmtofs",          /* SOAP */
        "@ unix",                                         /* Unix timestamp */
        "yyyy mm dd \\T hh : mi : ss",                            /* XMLRPC */
        "yyyy mm dd \\t hh mi ss",                      /* XMLRPC - compact */
        "yyyy - m - d \\T h : i : s"                                /* WDDX */
    };

    /* get the template filter in "[xx]" format */
    size_t filterlen;
    const char *filter = lc->get(vmg_ filterlen, LC_PARSE_FILTER);
    
    /* keep separate results for each pass */
    date_parse_result result(cal);

    /*
     *   Run through the format list as many times as it takes to either
     *   consume the whole source string, or fail to find a matching format.
     *   We have multiple format parts that can be specified individually or
     *   in combination (time, date, time + date, date + time, etc).
     */
    int fcapi;
    for (fcapi = 0 ; len != 0 ; ++fcapi)
    {
        /* we haven't found a best result for this pass yet */
        int bestlen = 0;
        date_parse_result bestres(cal);
        
        /* search the list for a match */
        format_iter fi(vmg_ fmt, countof(fmt), custom);
        size_t curfmtl;
        const char *curfmt;
        while ((curfmt = fi.next(vmg_ curfmtl)) != 0)
        {
            /* set up at the current position */
            const char *curstr = str;
            size_t curlen = len;

            /* remember the original format string */
            const char *curfmt0 = curfmt;
            size_t curfmtl0 = curfmtl;

            /* if this is a "[us]" or "[eu]" local entry, filter it */
            if (curfmtl >= 3 && curfmt[0] == '[')
            {
                /* get the ']' */
                const char *rb = lib_strnchr(curfmt+1, curfmtl-1, ']');

                /* 
                 *   if we found it, and the contents of the brackets don't
                 *   match the locale filter string, filter out this format 
                 */
                if (rb != 0
                    && (rb - curfmt - 1 != (int)filterlen
                        || memicmp(curfmt + 1, filter, filterlen) != 0))
                    continue;

                /* skip the filter string */
                curfmtl -= rb - curfmt + 1;
                curfmt = rb + 1;
            }

            /* start with the results from previous passes */
            date_parse_result curres(result);

            /* try matching this format at the current position */
            if (parse_string_fmt(vmg_ &curres, curstr, curlen,
                                 curfmt, curfmtl, lc))
            {
                /* if this is the longest match of this pass, keep it */
                int reslen = curstr - str;
                if (reslen > bestlen)
                {
                    /* remember this as the best result so far */
                    bestlen = reslen;
                    bestres = curres;

                    /* remember the format string it matches, if desired */
                    if (nfmtlist != 0 && fcapi < *nfmtlist)
                        fmtlist[fcapi].set(curfmt0, curfmtl0);
                }
            }
        }

        /* if we didn't find a match on this round, we've failed */
        if (bestlen == 0)
            return FALSE;

        /* skip what we matched for the best result of this pass */
        str += bestlen;
        len -= bestlen;

        /* keep the best result for this pass */
        result = bestres;

        /* skip spaces and other separator characters */
        for ( ; len != 0 && strchr(" \t;,:", *str) != 0 ; ++str, --len) ;
    }

    /* default to the reference time zone */
    result.def_tz(reftz);

    /* adjust the reference time to the appropriate local time zone */
    result.utc_to_local(refday, reftime);

    /* set missing date elements to the corresponding reference date values */
    result.def_date(refday);
    
    /* set any missing time elements to midnight or zero past the hour/min */
    result.def_time(0, 0, 0, 0);

    /* convert to our internal day and time representation */
    dayno = result.dayno();
    daytime = result.daytime();
    caldate_t::normalize(dayno, daytime);

    /* translate the final time value from the specified local time to UTC */
    result.local_to_utc(dayno, daytime);

    /* copy back the results if the caller's interested */
    if (resultp != 0)
        memcpy(resultp, &result, sizeof(result));

    /* tell the caller how many format strings we matched, if desired */
    if (nfmtlist != 0)
        *nfmtlist = fcapi;

    /* success */
    return TRUE;
}